

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O3

bool __thiscall adios2::ADIOS::RemoveIO(ADIOS *this,string *name)

{
  element_type *peVar1;
  pointer pcVar2;
  undefined1 uVar3;
  long *plVar4;
  size_type *psVar5;
  string local_78;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"for io name ",name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_78.field_2._M_allocated_capacity = *psVar5;
    local_78.field_2._8_8_ = plVar4[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar5;
    local_78._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_78._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  CheckPointer(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  peVar1 = (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + name->_M_string_length);
  uVar3 = adios2::core::ADIOS::RemoveIO(peVar1,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return (bool)uVar3;
}

Assistant:

bool ADIOS::RemoveIO(const std::string name)
{
    CheckPointer("for io name " + name + ", in call to ADIOS::RemoveIO");
    return m_ADIOS->RemoveIO(name);
}